

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

FunctionDefinition * __thiscall
stackjit::ClassMetadata::getVirtualFunctionRootDefinition
          (ClassMetadata *this,FunctionDefinition *funcDef)

{
  bool bVar1;
  __type _Var2;
  ClassMetadata *pCVar3;
  reference ppFVar4;
  string *__lhs;
  string *__rhs;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2;
  FunctionDefinition *pFVar5;
  FunctionDefinition *parentDef;
  iterator __end2;
  iterator __begin2;
  vector<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
  *__range2;
  FunctionDefinition *funcDef_local;
  ClassMetadata *this_local;
  
  if (this->mParentClass != (ClassType *)0x0) {
    pCVar3 = ClassType::metadata(this->mParentClass);
    __end2 = std::
             vector<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
             ::begin(&pCVar3->mVirtualFunctions);
    parentDef = (FunctionDefinition *)
                std::
                vector<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
                ::end(&pCVar3->mVirtualFunctions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_stackjit::FunctionDefinition_**,_std::vector<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>_>
                                       *)&parentDef), bVar1) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<const_stackjit::FunctionDefinition_**,_std::vector<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>_>
                ::operator*(&__end2);
      pFVar5 = *ppFVar4;
      __lhs = FunctionDefinition::memberName_abi_cxx11_(funcDef);
      __rhs = FunctionDefinition::memberName_abi_cxx11_(pFVar5);
      _Var2 = std::operator==(__lhs,__rhs);
      if (_Var2) {
        list1 = FunctionDefinition::callParameters(funcDef);
        list2 = FunctionDefinition::callParameters(pFVar5);
        bVar1 = TypeSystem::areEqual(list1,list2);
        if (bVar1) {
          pCVar3 = ClassType::metadata(this->mParentClass);
          pFVar5 = getVirtualFunctionRootDefinition(pCVar3,pFVar5);
          return pFVar5;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_stackjit::FunctionDefinition_**,_std::vector<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>_>
      ::operator++(&__end2);
    }
  }
  return funcDef;
}

Assistant:

const FunctionDefinition* ClassMetadata::getVirtualFunctionRootDefinition(const FunctionDefinition* funcDef) const {
		if (mParentClass != nullptr) {
			for (auto parentDef : mParentClass->metadata()->mVirtualFunctions) {
				if (funcDef->memberName() == parentDef->memberName()
					&& TypeSystem::areEqual(funcDef->callParameters(), parentDef->callParameters())) {
					return mParentClass->metadata()->getVirtualFunctionRootDefinition(parentDef);
				}
			}
		}

		return funcDef;
	}